

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInfo.cpp
# Opt level: O0

InfoStatus
getInfoIndex(HighsLogOptions *report_log_options,string *name,
            vector<InfoRecord_*,_std::allocator<InfoRecord_*>_> *info_records,HighsInt *index)

{
  __type _Var1;
  size_type sVar2;
  undefined8 uVar3;
  int *in_RCX;
  vector<InfoRecord_*,_std::allocator<InfoRecord_*>_> *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  HighsLogOptions *in_RDI;
  HighsInt num_info;
  
  sVar2 = std::vector<InfoRecord_*,_std::allocator<InfoRecord_*>_>::size(in_RDX);
  *in_RCX = 0;
  while( true ) {
    if ((int)sVar2 <= *in_RCX) {
      uVar3 = std::__cxx11::string::c_str();
      highsLogUser(in_RDI,kError,"getInfoIndex: Info \"%s\" is unknown\n",uVar3);
      return kUnknownInfo;
    }
    std::vector<InfoRecord_*,_std::allocator<InfoRecord_*>_>::operator[](in_RDX,(long)*in_RCX);
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_RDI,in_RSI);
    if (_Var1) break;
    *in_RCX = *in_RCX + 1;
  }
  return kOk;
}

Assistant:

InfoStatus getInfoIndex(const HighsLogOptions& report_log_options,
                        const std::string& name,
                        const std::vector<InfoRecord*>& info_records,
                        HighsInt& index) {
  HighsInt num_info = info_records.size();
  for (index = 0; index < num_info; index++)
    if (info_records[index]->name == name) return InfoStatus::kOk;
  highsLogUser(report_log_options, HighsLogType::kError,
               "getInfoIndex: Info \"%s\" is unknown\n", name.c_str());
  return InfoStatus::kUnknownInfo;
}